

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O1

int wally_cleanup(uint32_t flags)

{
  int iVar1;
  
  iVar1 = -2;
  if (flags == 0) {
    iVar1 = 0;
    if (global_ctx != (secp256k1_context *)0x0) {
      secp256k1_context_destroy(global_ctx);
      global_ctx = (secp256k1_context *)0x0;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_cleanup(uint32_t flags)
{
    if (flags)
        return WALLY_EINVAL;
    if (global_ctx) {
        wally_secp_context_free(global_ctx);
        global_ctx = NULL;
    }
    return WALLY_OK;
}